

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::semiintersect_iterator
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *this,iterator_range<const_int_*> *first,iterator_range<const_int_*> *last,
          size_t min_items)

{
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var1;
  
  (this->m_begin)._M_current = first;
  (this->m_end)._M_current = last;
  this->m_min_items = min_items;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,__gnu_cxx::__ops::_Iter_negate<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::greater<void>>::semiintersect_iterator(__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,unsigned_long,std::greater<void>)::_lambda(auto:1_const&)_1_>>
                    (first,last,this);
  if (_Var1._M_current != last) {
    __assert_fail("std::all_of(m_begin, m_end, [this] (const auto & range) { return boost::algorithm::is_sorted(range, m_compare); })"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0x84,
                  "burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::semiintersect_iterator(outer_range_iterator, outer_range_iterator, std::size_t, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
                 );
  }
  if (min_items != 0) {
    settle(this);
    return;
  }
  __assert_fail(anon_var_dwarf_4903e9,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0x85,
                "burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::semiintersect_iterator(outer_range_iterator, outer_range_iterator, std::size_t, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
               );
}

Assistant:

semiintersect_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                std::size_t min_items,
                Compare compare = Compare()
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_min_items(min_items),
            m_compare(compare)
        {
            BOOST_ASSERT(std::all_of(m_begin, m_end,
                [this] (const auto & range)
                {
                    return boost::algorithm::is_sorted(range, m_compare);
                }));
            BOOST_ASSERT_MSG(min_items > 0, "Невозможно получить полупересечение из нуля элементов.");

            settle();
        }